

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_>::grow
          (basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> *this,size_t size)

{
  size_t sVar1;
  basic_buffer<wchar_t> *pbVar2;
  wchar_t *p;
  ulong in_RSI;
  basic_buffer<wchar_t> *in_RDI;
  wchar_t *new_data;
  wchar_t *old_data;
  size_t new_capacity;
  size_t old_capacity;
  wchar_t *in_stack_ffffffffffffffa8;
  allocator<wchar_t> *in_stack_ffffffffffffffb0;
  basic_buffer<wchar_t> *this_00;
  basic_buffer<wchar_t> *__last;
  wchar_t *__first;
  size_t local_20;
  
  sVar1 = internal::basic_buffer<wchar_t>::capacity(in_RDI);
  local_20 = sVar1 + (sVar1 >> 1);
  if (local_20 < in_RSI) {
    local_20 = in_RSI;
  }
  pbVar2 = (basic_buffer<wchar_t> *)internal::basic_buffer<wchar_t>::data(in_RDI);
  p = internal::allocate<std::allocator<wchar_t>>
                (in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8);
  this_00 = pbVar2;
  __last = pbVar2;
  sVar1 = internal::basic_buffer<wchar_t>::size(in_RDI);
  __first = (wchar_t *)((long)&this_00->_vptr_basic_buffer + sVar1 * 4);
  internal::make_checked<wchar_t>(p,local_20);
  std::uninitialized_copy<wchar_t*,wchar_t*>(__first,(wchar_t *)__last,(wchar_t *)this_00);
  internal::basic_buffer<wchar_t>::set(in_RDI,p,local_20);
  if (pbVar2 != in_RDI + 1) {
    __gnu_cxx::new_allocator<wchar_t>::deallocate
              ((new_allocator<wchar_t> *)this_00,in_stack_ffffffffffffffa8,0x15eb0e);
  }
  return;
}

Assistant:

void basic_memory_buffer<T, SIZE, Allocator>::grow(std::size_t size) {
  std::size_t old_capacity = this->capacity();
  std::size_t new_capacity = old_capacity + old_capacity / 2;
  if (size > new_capacity)
      new_capacity = size;
  T *old_data = this->data();
  T *new_data = internal::allocate<Allocator>(*this, new_capacity);
  // The following code doesn't throw, so the raw pointer above doesn't leak.
  std::uninitialized_copy(old_data, old_data + this->size(),
                          internal::make_checked(new_data, new_capacity));
  this->set(new_data, new_capacity);
  // deallocate must not throw according to the standard, but even if it does,
  // the buffer already uses the new storage and will deallocate it in
  // destructor.
  if (old_data != store_)
    Allocator::deallocate(old_data, old_capacity);
}